

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

StringEnumeration * icu_63::TimeZoneNamesImpl::_getAvailableMetaZoneIDs(UErrorCode *status)

{
  UVector *mzIDs;
  MetaZoneIDsEnumeration *this;
  size_t in_RSI;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    mzIDs = ZoneMeta::getAvailableMetazoneIDs();
    this = (MetaZoneIDsEnumeration *)UMemory::operator_new((UMemory *)0x90,in_RSI);
    if (mzIDs == (UVector *)0x0) {
      if (this != (MetaZoneIDsEnumeration *)0x0) {
        MetaZoneIDsEnumeration::MetaZoneIDsEnumeration(this);
        return &this->super_StringEnumeration;
      }
    }
    else if (this != (MetaZoneIDsEnumeration *)0x0) {
      MetaZoneIDsEnumeration::MetaZoneIDsEnumeration(this,mzIDs);
      return &this->super_StringEnumeration;
    }
  }
  return (StringEnumeration *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }